

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffchdu(fitsfile *fptr,int *status)

{
  long lVar1;
  long lVar2;
  int *in_RSI;
  int *in_RDI;
  int ntilebins;
  int stdriver;
  int ii;
  char message [81];
  int *in_stack_00000090;
  fitsfile *in_stack_00000098;
  int *in_stack_00000200;
  fitsfile *in_stack_00000208;
  int *in_stack_00000af0;
  fitsfile *in_stack_00000af8;
  int in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar3;
  char *in_stack_ffffffffffffff98;
  
  if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
    if (*(int *)(*(long *)(in_RDI + 2) + 0x5c) == 1) {
      urltype2driver(in_stack_ffffffffffffff98,
                     (int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      if (*(int *)(*(long *)(in_RDI + 2) + 4) != in_stack_ffffffffffffff90) {
        ffrdef(in_stack_00000098,in_stack_00000090);
      }
      if (0 < *(long *)(*(long *)(in_RDI + 2) + 0x3e0)) {
        ffuptf(in_stack_00000208,in_stack_00000200);
      }
      ffpdfl(in_stack_00000af8,in_stack_00000af0);
    }
  }
  else {
    ffmahd(_stdriver,ntilebins,in_RDI,in_RSI);
  }
  if ((*(int *)(*(long *)(in_RDI + 2) + 8) == 1) && (*(long *)(*(long *)(in_RDI + 2) + 0x3d0) != 0))
  {
    free(*(void **)(*(long *)(in_RDI + 2) + 0x3d0));
    *(undefined8 *)(*(long *)(in_RDI + 2) + 0x3d0) = 0;
    if (*(long *)(*(long *)(in_RDI + 2) + 0x530) != 0) {
      lVar1 = *(long *)(*(long *)(in_RDI + 2) + 0x498);
      lVar2 = *(long *)(*(long *)(in_RDI + 2) + 0x440);
      for (iVar3 = 0; iVar3 < (int)((lVar1 + -1) / lVar2) + 1; iVar3 = iVar3 + 1) {
        if (*(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x548) + (long)iVar3 * 8) != 0) {
          free(*(void **)(*(long *)(*(long *)(in_RDI + 2) + 0x548) + (long)iVar3 * 8));
        }
        if (*(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x550) + (long)iVar3 * 8) != 0) {
          free(*(void **)(*(long *)(*(long *)(in_RDI + 2) + 0x550) + (long)iVar3 * 8));
        }
      }
      free(*(void **)(*(long *)(in_RDI + 2) + 0x558));
      free(*(void **)(*(long *)(in_RDI + 2) + 0x540));
      free(*(void **)(*(long *)(in_RDI + 2) + 0x538));
      free(*(void **)(*(long *)(in_RDI + 2) + 0x550));
      free(*(void **)(*(long *)(in_RDI + 2) + 0x548));
      free(*(void **)(*(long *)(in_RDI + 2) + 0x530));
      *(undefined8 *)(*(long *)(in_RDI + 2) + 0x558) = 0;
      *(undefined8 *)(*(long *)(in_RDI + 2) + 0x540) = 0;
      *(undefined8 *)(*(long *)(in_RDI + 2) + 0x538) = 0;
      *(undefined8 *)(*(long *)(in_RDI + 2) + 0x550) = 0;
      *(undefined8 *)(*(long *)(in_RDI + 2) + 0x548) = 0;
      *(undefined8 *)(*(long *)(in_RDI + 2) + 0x530) = 0;
    }
  }
  if ((0 < *in_RSI) && (*in_RSI != 999)) {
    snprintf(&stack0xffffffffffffff98,0x51,"Error while closing HDU number %d (ffchdu).",
             (ulong)*(uint *)(*(long *)(in_RDI + 2) + 0x54));
    ffpmsg((char *)0x16a759);
  }
  return *in_RSI;
}

Assistant:

int ffchdu(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)         /* IO - error status     */
{
/*
  close the current HDU.  If we have write access to the file, then:
    - write the END keyword and pad header with blanks if necessary
    - check the data fill values, and rewrite them if not correct
*/
    char message[FLEN_ERRMSG];
    int ii, stdriver, ntilebins;

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
        /* no need to do any further updating of the HDU */
    }
    else if ((fptr->Fptr)->writemode == 1)
    {
        urltype2driver("stream://", &stdriver);

        /* don't rescan header in special case of writing to stdout */
        if (((fptr->Fptr)->driver != stdriver)) 
             ffrdef(fptr, status); 

        if ((fptr->Fptr)->heapsize > 0) {
          ffuptf(fptr, status);  /* update the variable length TFORM values */
        }
	
        ffpdfl(fptr, status);  /* insure correct data fill values */
    }

    if ((fptr->Fptr)->open_count == 1)
    {

    /* free memory for the CHDU structure only if no other files are using it */
        if ((fptr->Fptr)->tableptr)
        {
            free((fptr->Fptr)->tableptr);
           (fptr->Fptr)->tableptr = NULL;

          /* free the tile-compressed image cache, if it exists */
          if ((fptr->Fptr)->tilerow) {

           ntilebins = 
	    (((fptr->Fptr)->znaxis[0] - 1) / ((fptr->Fptr)->tilesize[0])) + 1;

           for (ii = 0; ii < ntilebins; ii++) {
             if ((fptr->Fptr)->tiledata[ii]) {
	       free((fptr->Fptr)->tiledata[ii]);
             }

             if ((fptr->Fptr)->tilenullarray[ii]) {
	       free((fptr->Fptr)->tilenullarray[ii]);
             }
            }
	    
	    free((fptr->Fptr)->tileanynull);
	    free((fptr->Fptr)->tiletype);	   
	    free((fptr->Fptr)->tiledatasize);
	    free((fptr->Fptr)->tilenullarray);
	    free((fptr->Fptr)->tiledata);
	    free((fptr->Fptr)->tilerow);

	    (fptr->Fptr)->tileanynull = 0;
	    (fptr->Fptr)->tiletype = 0;	   
	    (fptr->Fptr)->tiledatasize = 0;
	    (fptr->Fptr)->tilenullarray = 0;
	    (fptr->Fptr)->tiledata = 0;
	    (fptr->Fptr)->tilerow = 0;
          }
        }
    }

    if (*status > 0 && *status != NO_CLOSE_ERROR)
    {
        snprintf(message,FLEN_ERRMSG,
        "Error while closing HDU number %d (ffchdu).", (fptr->Fptr)->curhdu);
        ffpmsg(message);
    }
    return(*status);
}